

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::SocketInitiator::onDisconnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  Session *this_00;
  iterator iVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  socket_handle local_2c;
  
  local_2c = s;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
          ::find(&(this->m_connections)._M_t,&local_2c);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
          ::find(&(this->m_pendingConnections)._M_t,&local_2c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_connections)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = iVar1._M_node[1]._M_parent;
  }
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = iVar2._M_node[1]._M_parent;
  }
  if (p_Var3 != (_Base_ptr)0x0) {
    Initiator::setDisconnected
              (&this->super_Initiator,(SessionID *)&p_Var3[0x105]._M_right[1]._M_left);
    this_00 = (Session *)p_Var3[0x105]._M_right;
    if (this_00 != (Session *)0x0) {
      Session::disconnect(this_00);
      Initiator::setDisconnected(&this->super_Initiator,&this_00->m_sessionID);
    }
    (**(code **)(*(long *)p_Var3 + 8))(p_Var3);
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&(this->m_connections)._M_t,&local_2c);
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&(this->m_pendingConnections)._M_t,&local_2c);
  }
  return;
}

Assistant:

void SocketInitiator::onDisconnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  SocketConnections::iterator j = m_pendingConnections.find(s);

  SocketConnection *pSocketConnection = 0;
  if (i != m_connections.end()) {
    pSocketConnection = i->second;
  }
  if (j != m_pendingConnections.end()) {
    pSocketConnection = j->second;
  }
  if (!pSocketConnection) {
    return;
  }

  setDisconnected(pSocketConnection->getSession()->getSessionID());

  Session *pSession = pSocketConnection->getSession();
  if (pSession) {
    pSession->disconnect();
    setDisconnected(pSession->getSessionID());
  }

  delete pSocketConnection;
  m_connections.erase(s);
  m_pendingConnections.erase(s);
}